

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_simple_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MiniBusClient *this_00;
  char *in_R9;
  string_view str;
  string_view str_00;
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar2;
  uint32_t rid;
  shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tok;
  MiniBusEncoder encoder;
  unique_lock<std::mutex> lock;
  uint32_t local_7c;
  shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  MiniBusEncoder local_60;
  unique_lock<std::mutex> local_40;
  
  this_00 = (MiniBusClient *)command._M_len;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this_00->mtx);
  local_7c = select_rid(this_00);
  local_60.buffer._M_dataplus._M_p = (pointer)&local_60.buffer.field_2;
  local_60.buffer._M_string_length = 0;
  local_60.buffer.field_2._M_local_buf[0] = '\0';
  MiniBusEncoder::insert_rid(&local_60,local_7c);
  str._M_str = (char *)payload._M_len;
  str._M_len = (size_t)command._M_str;
  MiniBusEncoder::insert_short_string(&local_60,str);
  str_00._M_str = in_R9;
  str_00._M_len = (size_t)payload._M_str;
  MiniBusEncoder::insert_long_string(&local_60,str_00);
  local_78.
  super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_60.buffer._M_string_length;
  if ((element_type *)local_60.buffer._M_string_length != (element_type *)0x0) {
    local_78.
    super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_60.buffer._M_dataplus._M_p;
  }
  local_78.
  super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.buffer._M_string_length;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::detail::transfer_all_t>
            (&this_00->socket,&local_78,0);
  std::make_shared<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>();
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  _M_emplace_unique<unsigned_int&,std::shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>&>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>,std::_Select1st<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)&this_00->reqmap,&local_7c,&local_78);
  _Var1._M_pi = local_78.
                super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_78.
  super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this =
       local_78.
       super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  (this->info).super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_78.
  super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.
              super___shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_60);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar2.
           super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<std::optional<std::string>>>
  send_simple(std::string_view command, std::string_view payload = {}) {
    std::unique_lock lock{mtx};
    auto rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<NotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }